

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Vec_Ptr_t *
Aig_ManPartitionSmart(Aig_Man_t *p,int nSuppSizeLimit,int fVerbose,Vec_Ptr_t **pvPartSupps)

{
  int iVar1;
  int i_00;
  uint uVar2;
  abctime aVar3;
  Vec_Ptr_t *p_00;
  abctime aVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *vPartsAll_00;
  Vec_Ptr_t *vPartSuppsAll_00;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  uint *puVar9;
  void *pvVar10;
  abctime clk;
  int iOut;
  int iPart;
  int i;
  Vec_Int_t *vTemp;
  Vec_Int_t *vPartSupp;
  Vec_Int_t *vPart;
  Vec_Int_t *vOne;
  Vec_Ptr_t *vPartSuppsAll;
  Vec_Ptr_t *vPartsAll2;
  Vec_Ptr_t *vPartsAll;
  Vec_Ptr_t *vSupports;
  Vec_Ptr_t *vPartSuppsBit;
  Vec_Ptr_t **pvPartSupps_local;
  int fVerbose_local;
  int nSuppSizeLimit_local;
  Aig_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  p_00 = Aig_ManSupports(p);
  if (fVerbose != 0) {
    Abc_Print(1,"%s =","Supps");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
  }
  pVVar5 = Vec_PtrAlloc(1000);
  aVar3 = Abc_Clock();
  vPartsAll_00 = Vec_PtrAlloc(0x100);
  vPartSuppsAll_00 = Vec_PtrAlloc(0x100);
  for (iOut = 0; iVar1 = Vec_PtrSize(p_00), iOut < iVar1; iOut = iOut + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_00,iOut);
    iVar1 = Vec_IntPop(pVVar6);
    i_00 = Aig_ManPartitionSmartFindPart(vPartSuppsAll_00,vPartsAll_00,pVVar5,nSuppSizeLimit,pVVar6)
    ;
    if (i_00 == -1) {
      pVVar7 = Vec_IntAlloc(0x20);
      Vec_IntPush(pVVar7,iVar1);
      pVVar8 = Vec_IntDup(pVVar6);
      Vec_PtrPush(vPartsAll_00,pVVar7);
      Vec_PtrPush(vPartSuppsAll_00,pVVar8);
      iVar1 = Aig_ManCiNum(p);
      puVar9 = Aig_ManSuppCharStart(pVVar6,iVar1);
      Vec_PtrPush(pVVar5,puVar9);
    }
    else {
      pVVar7 = (Vec_Int_t *)Vec_PtrEntry(vPartsAll_00,i_00);
      Vec_IntPush(pVVar7,iVar1);
      pVVar7 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll_00,i_00);
      pVVar8 = Vec_IntTwoMerge(pVVar7,pVVar6);
      Vec_IntFree(pVVar7);
      Vec_PtrWriteEntry(vPartSuppsAll_00,i_00,pVVar8);
      puVar9 = (uint *)Vec_PtrEntry(pVVar5,i_00);
      iVar1 = Aig_ManCiNum(p);
      Aig_ManSuppCharAdd(puVar9,pVVar6,iVar1);
    }
  }
  for (iOut = 0; iVar1 = Vec_PtrSize(pVVar5), iOut < iVar1; iOut = iOut + 1) {
    pvVar10 = Vec_PtrEntry(pVVar5,iOut);
    if (pvVar10 != (void *)0x0) {
      free(pvVar10);
    }
  }
  Vec_PtrFree(pVVar5);
  if (fVerbose != 0) {
    Abc_Print(1,"%s =","Parts");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
  }
  Abc_Clock();
  for (iOut = 0; iVar1 = Vec_PtrSize(vPartSuppsAll_00), iOut < iVar1; iOut = iOut + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll_00,iOut);
    Vec_IntPush(pVVar6,iOut);
  }
  Vec_VecSort((Vec_Vec_t *)vPartSuppsAll_00,1);
  pVVar5 = Vec_PtrAlloc(0x100);
  for (iOut = 0; iVar1 = Vec_PtrSize(vPartSuppsAll_00), iOut < iVar1; iOut = iOut + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll_00,iOut);
    iVar1 = Vec_IntPop(pVVar6);
    pvVar10 = Vec_PtrEntry(vPartsAll_00,iVar1);
    Vec_PtrPush(pVVar5,pvVar10);
  }
  Vec_PtrFree(vPartsAll_00);
  Aig_ManPartitionCompact(pVVar5,vPartSuppsAll_00,nSuppSizeLimit);
  if (fVerbose != 0) {
    uVar2 = Vec_PtrSize(pVVar5);
    printf("Created %d partitions.\n",(ulong)uVar2);
  }
  Vec_VecFree((Vec_Vec_t *)p_00);
  if (pvPartSupps == (Vec_Ptr_t **)0x0) {
    Vec_VecFree((Vec_Vec_t *)vPartSuppsAll_00);
  }
  else {
    *pvPartSupps = vPartSuppsAll_00;
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Aig_ManPartitionSmart( Aig_Man_t * p, int nSuppSizeLimit, int fVerbose, Vec_Ptr_t ** pvPartSupps )
{
    Vec_Ptr_t * vPartSuppsBit;
    Vec_Ptr_t * vSupports, * vPartsAll, * vPartsAll2, * vPartSuppsAll;//, * vPartPtr;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut;
    abctime clk;

    // compute the supports for all outputs
clk = Abc_Clock();
    vSupports = Aig_ManSupports( p );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}
    // start char-based support representation
    vPartSuppsBit = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
    {
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
        iPart = Aig_ManPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsBit, nSuppSizeLimit, vOne );
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsBit, Aig_ManSuppCharStart(vOne, Aig_ManCiNum(p)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Aig_ManSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsBit, iPart), vOne, Aig_ManCiNum(p) );
        }
    }

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsBit, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsBit );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // reorder partitions in the decreasing order of support sizes
    // remember partition number in each partition support
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    Aig_ManPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );
    if ( fVerbose )
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );

if ( fVerbose )
{
//ABC_PRT( "Comps", Abc_Clock() - clk );
}

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupports );
    if ( pvPartSupps == NULL )
        Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
    else
        *pvPartSupps = vPartSuppsAll;
/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Aig_ManCo(p, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}